

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::clara::TextFlow::Column::iterator::addIndentAndSuffix(iterator *this,string *plain)

{
  size_t sVar1;
  string *in_RDX;
  iterator *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  allocator local_39;
  string local_38 [32];
  string *local_18;
  
  local_18 = in_RDX;
  sVar1 = indent(in_RSI);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_38,sVar1,' ',&local_39);
  if ((in_RSI->m_suffix & 1U) == 0) {
    ::std::__cxx11::string::string((string *)&stack0xffffffffffffff90,local_18);
  }
  else {
    ::std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
                   in_RDI);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  ::std::__cxx11::string::~string(local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return in_RDI;
}

Assistant:

auto addIndentAndSuffix(std::string const &plain) const -> std::string {
			return std::string(indent(), ' ') + (m_suffix ? plain + "-" : plain);
		}